

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O2

optional<bool> __thiscall tinyusdz::primvar::PrimVar::get_value<bool>(PrimVar *this)

{
  bool bVar1;
  PrimVar *in_RSI;
  undefined1 local_1a;
  undefined1 local_19;
  
  bVar1 = is_blocked(in_RSI);
  if (!bVar1) {
    bVar1 = has_value(in_RSI);
    if (bVar1) {
      tinyusdz::value::Value::get_value<bool>((Value *)&stack0xffffffffffffffe6,SUB81(in_RSI,0));
      *(undefined1 *)&(this->_value).v_.storage = local_1a;
      if (local_1a == '\x01') {
        *(undefined1 *)((long)&(this->_value).v_.storage + 1) = local_19;
      }
      goto LAB_001f4835;
    }
  }
  *(undefined2 *)&(this->_value).v_.storage = 0;
LAB_001f4835:
  return SUB82(this,0);
}

Assistant:

nonstd::optional<T> get_value() const {

    if (is_blocked()) {
      return nonstd::nullopt;
    }

    if (!has_default()) {
      return nonstd::nullopt;
    }

    return _value.get_value<T>();
  }